

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_mpi(uchar **p,uchar *start,mbedtls_mpi *X)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t buflen;
  
  buflen = mbedtls_mpi_size(X);
  puVar1 = *p;
  iVar2 = -0x6c;
  iVar3 = iVar2;
  if ((start <= puVar1) && (buflen <= (ulong)((long)puVar1 - (long)start))) {
    *p = puVar1 + -buflen;
    iVar3 = mbedtls_mpi_write_binary(X,puVar1 + -buflen,buflen);
    if (iVar3 == 0) {
      if ((X->s == 1) && (puVar1 = *p, (char)*puVar1 < '\0')) {
        if (puVar1 == start || (long)puVar1 - (long)start < 0) {
          return -0x6c;
        }
        *p = puVar1 + -1;
        puVar1[-1] = '\0';
        buflen = buflen + 1;
      }
      iVar4 = mbedtls_asn1_write_len(p,start,buflen);
      iVar3 = iVar4;
      if ((-1 < iVar4) &&
         (puVar1 = *p, iVar3 = iVar2, puVar1 != start && -1 < (long)puVar1 - (long)start)) {
        *p = puVar1 + -1;
        puVar1[-1] = '\x02';
        iVar3 = (int)buflen + iVar4 + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_write_mpi( unsigned char **p, unsigned char *start, const mbedtls_mpi *X )
{
    int ret;
    size_t len = 0;

    // Write the MPI
    //
    len = mbedtls_mpi_size( X );

    if( *p < start || (size_t)( *p - start ) < len )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    (*p) -= len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( X, *p, len ) );

    // DER format assumes 2s complement for numbers, so the leftmost bit
    // should be 0 for positive numbers and 1 for negative numbers.
    //
    if( X->s ==1 && **p & 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = 0x00;
        len += 1;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_INTEGER ) );

    ret = (int) len;

cleanup:
    return( ret );
}